

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextProvider.cpp
# Opt level: O2

char __thiscall TextProviderString::peek_next(TextProviderString *this)

{
  pointer pcVar1;
  element_type *peVar2;
  int iVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var4;
  char *pcVar5;
  allocator<char> local_59;
  string local_58 [32];
  string local_38 [32];
  
  if ((this->m_iterator).
      super__Optional_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
      ._M_payload.
      super__Optional_payload_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_engaged == false) {
    peVar2 = (this->super_TextProvider).m_logger.
             super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string
              (local_38,(string *)&TextProvider::m_parser_text_provider_log_cat_abi_cxx11_);
    std::__cxx11::string::string<std::allocator<char>>
              (local_58,
               "Cannot yet use peek before a first advance with the textProviderString, sorry :/",
               &local_59);
    (*peVar2->_vptr_PSLogger[2])(peVar2,4,local_38,local_58);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string(local_38);
    (this->super_TextProvider).m_has_error = true;
  }
  else {
    p_Var4 = std::
             optional<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::value(&this->m_iterator);
    pcVar1 = (this->m_text)._M_dataplus._M_p;
    pcVar5 = p_Var4->_M_current;
    iVar3 = (*(this->super_TextProvider)._vptr_TextProvider[2])(this);
    if (((char)iVar3 != '\0') &&
       ((ulong)(long)(((int)pcVar5 - (int)pcVar1) + 2) < (this->m_text)._M_string_length)) {
      pcVar5 = (char *)std::__cxx11::string::at((ulong)&this->m_text);
      return *pcVar5;
    }
  }
  return '\0';
}

Assistant:

char TextProviderString::peek_next()
{
	if( !m_iterator.has_value())
	{
		m_logger->log(PSLogger::LogType::Error, m_parser_text_provider_log_cat,
			"Cannot yet use peek before a first advance with the textProviderString, sorry :/");
		m_has_error = true;
		return '\0';
	}

	int peeked_at_index = (int)(m_iterator.value() - m_text.begin()) + 2;

	if(is_valid() && peeked_at_index < m_text.size())
	{
		return m_text.at(peeked_at_index);
	}
	else
	{
		return '\0';
	}
}